

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O2

int telnet_vprintf(telnet_t *telnet,char *fmt,__va_list_tag *va)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  int *piVar4;
  __va_list_tag *__arg;
  ulong uVar5;
  char *__buf;
  int __fd;
  uint uVar6;
  ulong uVar7;
  va_list va_temp;
  char buffer [1024];
  
  va_temp[0].gp_offset = va->gp_offset;
  va_temp[0].fp_offset = va->fp_offset;
  va_temp[0].overflow_arg_area = va->overflow_arg_area;
  __arg = va_temp;
  va_temp[0].reg_save_area = va->reg_save_area;
  pcVar3 = buffer;
  uVar2 = vsnprintf(pcVar3,0x400,fmt,__arg);
  if (0x3ff < uVar2) {
    pcVar3 = (char *)malloc((ulong)(uVar2 + 1));
    if (pcVar3 == (char *)0x0) {
      piVar4 = __errno_location();
      pcVar3 = strerror(*piVar4);
      _error(telnet,0x665,"telnet_vprintf",TELNET_ENOMEM,0,"malloc() failed: %s",pcVar3);
      return -1;
    }
    va_temp[0].reg_save_area = va->reg_save_area;
    __arg = va_temp;
    va_temp[0].gp_offset = va->gp_offset;
    va_temp[0].fp_offset = va->fp_offset;
    va_temp[0].overflow_arg_area = va->overflow_arg_area;
    uVar2 = vsnprintf(pcVar3,(ulong)(uVar2 + 1),fmt,__arg);
  }
  uVar5 = 0;
  uVar7 = 0;
  do {
    uVar6 = (uint)uVar7;
    __fd = (int)telnet;
    if (uVar2 == uVar5) {
      if (uVar2 != uVar6) {
        _send(__fd,pcVar3 + uVar7,(ulong)(uVar2 - uVar6),(int)__arg);
      }
      if (pcVar3 != buffer) {
        free(pcVar3);
      }
      return uVar2;
    }
    cVar1 = pcVar3[uVar5];
    if (((cVar1 == '\n') || (cVar1 == -1)) || (cVar1 == '\r')) {
      if (uVar5 != uVar7) {
        _send(__fd,pcVar3 + uVar7,(ulong)((int)uVar5 - uVar6),(int)__arg);
        cVar1 = pcVar3[uVar5];
      }
      uVar7 = (ulong)((int)uVar5 + 1);
      if (cVar1 == '\n') {
        __buf = "\r\n";
      }
      else {
        if (cVar1 != '\r') {
          if (cVar1 == -1) {
            telnet_iac(telnet,0xff);
          }
          goto LAB_00102d75;
        }
        __buf = "\r";
      }
      _send(__fd,__buf,2,(int)__arg);
    }
LAB_00102d75:
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

int telnet_vprintf(telnet_t *telnet, const char *fmt, va_list va) {
	va_list va_temp;
	char buffer[1024];
	char *output = buffer;
	unsigned int rs, i, l;

	/* format */
	va_copy(va_temp, va);
	rs = vsnprintf(buffer, sizeof(buffer), fmt, va_temp);
	va_end(va_temp);

	if (rs >= sizeof(buffer)) {
		output = (char*)malloc(rs + 1);
		if (output == 0) {
			_error(telnet, __LINE__, __func__, TELNET_ENOMEM, 0,
					"malloc() failed: %s", strerror(errno));
			return -1;
		}

		va_copy(va_temp, va);
		rs = vsnprintf(output, rs + 1, fmt, va_temp);
		va_end(va_temp);
	}

	/* send */
	for (l = i = 0; i != rs; ++i) {
		/* special characters */
		if (output[i] == (char)TELNET_IAC || output[i] == '\r' ||
				output[i] == '\n') {
			/* dump prior portion of text */
			if (i != l)
				_send(telnet, output + l, i - l);
			l = i + 1;

			/* IAC -> IAC IAC */
			if (output[i] == (char)TELNET_IAC)
				telnet_iac(telnet, TELNET_IAC);
			/* automatic translation of \r -> CRNUL */
			else if (output[i] == '\r')
				_send(telnet, CRNUL, 2);
			/* automatic translation of \n -> CRLF */
			else if (output[i] == '\n')
				_send(telnet, CRLF, 2);
		}
	}

	/* send whatever portion of output is left */
	if (i != l) {
		_send(telnet, output + l, i - l);
	}

	/* free allocated memory, if any */
	if (output != buffer) {
		free(output);
	}

	return rs;
}